

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_line_from_file(FILE *fp,char **p)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long *in_RSI;
  FILE *in_RDI;
  char *p2;
  int alen;
  int allocsize;
  int llen;
  int r;
  int c;
  int local_28;
  int local_24;
  int local_20;
  int local_4;
  
  if (in_RDI == (FILE *)0x0) {
    local_4 = 0x16a;
  }
  else if (in_RSI == (long *)0x0) {
    local_4 = 0x16a;
  }
  else {
    local_20 = 0;
    local_24 = 0;
    pvVar3 = malloc(1);
    *in_RSI = (long)pvVar3;
    local_28 = 1;
    if (*in_RSI == 0) {
      local_4 = 0x168;
    }
    else {
      while( true ) {
        do {
          iVar1 = getc(in_RDI);
        } while (iVar1 == 0xd);
        if (iVar1 == -1) break;
        if (iVar1 == 10) goto LAB_001d05e5;
        iVar2 = ((local_24 + 0x3e9) / 1000) * 1000;
        if (local_28 < iVar2) {
          pvVar3 = realloc((void *)*in_RSI,(long)iVar2);
          if (pvVar3 == (void *)0x0) {
            local_20 = 0x168;
            local_24 = local_24 + 1;
            goto LAB_001d05e5;
          }
          *in_RSI = (long)pvVar3;
          local_28 = iVar2;
        }
        *(char *)(*in_RSI + (long)local_24) = (char)iVar1;
        local_24 = local_24 + 1;
      }
      iVar1 = ferror(in_RDI);
      if (iVar1 != 0) {
        local_20 = 0x169;
      }
      if (local_24 == 0) {
        return 0x16f;
      }
LAB_001d05e5:
      if (local_24 + 1 == local_28) {
        *(undefined1 *)(*in_RSI + (long)local_24) = 0;
      }
      else {
        pvVar3 = realloc((void *)*in_RSI,(long)(local_24 + 1));
        if (pvVar3 == (void *)0x0) {
          local_20 = 0x168;
        }
        else {
          *in_RSI = (long)pvVar3;
          *(undefined1 *)(*in_RSI + (long)local_24) = 0;
        }
      }
      if ((local_20 != 0x16f) && (local_20 != 0)) {
        free((void *)*in_RSI);
        *in_RSI = 0;
      }
      local_4 = local_20;
    }
  }
  return local_4;
}

Assistant:

int	ngp_line_from_file(FILE *fp, char **p)
 { int	c, r, llen, allocsize, alen;
   char	*p2;

   if (NULL == fp) return(NGP_NUL_PTR);		/* check for stupid args */
   if (NULL == p) return(NGP_NUL_PTR);		/* more foolproof checks */
   
   r = NGP_OK;					/* initialize stuff, reset err code */
   llen = 0;					/* 0 characters read so far */
   *p = (char *)ngp_alloc(1);			/* preallocate 1 byte */
   allocsize = 1;				/* signal that we have allocated 1 byte */
   if (NULL == *p) return(NGP_NO_MEMORY);	/* if this failed, system is in dire straits */

   for (;;)
    { c = getc(fp);				/* get next character */
      if ('\r' == c) continue;			/* carriage return character ?  Just ignore it */
      if (EOF == c)				/* EOF signalled ? */
        { 
          if (ferror(fp)) r = NGP_READ_ERR;	/* was it real error or simply EOF ? */
	  if (0 == llen) return(NGP_EOF);	/* signal EOF only if 0 characters read so far */
          break;
        }
      if ('\n' == c) break;			/* end of line character ? */
      
      llen++;					/* we have new character, make room for it */
      alen = ((llen + NGP_ALLOCCHUNK) / NGP_ALLOCCHUNK) * NGP_ALLOCCHUNK;
      if (alen > allocsize)
        { p2 = (char *)ngp_realloc(*p, alen);	/* realloc buffer, if there is need */
          if (NULL == p2)
            { r = NGP_NO_MEMORY;
              break;
            }
	  *p = p2;
          allocsize = alen;
        }
      (*p)[llen - 1] = c;			/* copy character to buffer */
    }

   llen++;					/* place for terminating \0 */
   if (llen != allocsize)
     { p2 = (char *)ngp_realloc(*p, llen);
       if (NULL == p2) r = NGP_NO_MEMORY;
       else
         { *p = p2;
           (*p)[llen - 1] = 0;			/* copy \0 to buffer */
         }         
     }
   else
     { (*p)[llen - 1] = 0;			/* necessary when line read was empty */
     }

   if ((NGP_EOF != r) && (NGP_OK != r))		/* in case of errors free resources */
     { ngp_free(*p);
       *p = NULL;
     }
   
   return(r);					/* return  status code */
 }